

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::EndColumns(void)

{
  ImGuiOldColumns *pIVar1;
  bool bVar2;
  int iVar3;
  ImGuiWindow *pIVar4;
  ImGuiOldColumnData *pIVar5;
  float fVar6;
  float _y;
  float fVar7;
  float x_1;
  int n_1;
  float xi;
  ImU32 col;
  bool held;
  bool hovered;
  ImRect column_hit_rect;
  float column_hit_hw;
  ImGuiID column_id;
  float x;
  ImGuiOldColumnData *column;
  int n;
  int dragging_column;
  float y2;
  float y1;
  bool is_being_resized;
  ImGuiOldColumnFlags flags;
  ImGuiOldColumns *columns;
  ImGuiWindow *window;
  ImGuiContext *g;
  int in_stack_ffffffffffffff70;
  float extra_flags;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  float in_stack_ffffffffffffff80;
  float in_stack_ffffffffffffff84;
  ImVec2 in_stack_ffffffffffffff88;
  float in_stack_ffffffffffffff90;
  ImU32 in_stack_ffffffffffffff94;
  ImVec2 local_64;
  float in_stack_ffffffffffffffa8;
  float in_stack_ffffffffffffffac;
  ImVec2 *in_stack_ffffffffffffffb0;
  float in_stack_ffffffffffffffb8;
  undefined4 uVar8;
  ImDrawList *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  int i;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar9;
  uint in_stack_ffffffffffffffe0;
  uint uVar10;
  
  pIVar4 = GetCurrentWindow();
  pIVar1 = (pIVar4->DC).CurrentColumns;
  PopItemWidth();
  if (1 < pIVar1->Count) {
    PopClipRect();
    ImDrawListSplitter::Merge
              ((ImDrawListSplitter *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffc8);
  }
  uVar10 = pIVar1->Flags;
  fVar6 = ImMax<float>(pIVar1->LineMaxY,(pIVar4->DC).CursorPos.y);
  pIVar1->LineMaxY = fVar6;
  (pIVar4->DC).CursorPos.y = pIVar1->LineMaxY;
  if ((uVar10 & 0x10) == 0) {
    (pIVar4->DC).CursorMaxPos.x = pIVar1->HostCursorMaxPosX;
  }
  in_stack_ffffffffffffffe0 = in_stack_ffffffffffffffe0 & 0xffffff;
  if (((uVar10 & 1) == 0) && ((pIVar4->SkipItems & 1U) == 0)) {
    fVar6 = ImMax<float>(pIVar1->HostCursorPosY,(pIVar4->ClipRect).Min.y);
    _y = ImMin<float>((pIVar4->DC).CursorPos.y,(pIVar4->ClipRect).Max.y);
    iVar9 = -1;
    for (i = 1; i < pIVar1->Count; i = i + 1) {
      pIVar5 = ImVector<ImGuiOldColumnData>::operator[](&pIVar1->Columns,i);
      extra_flags = (pIVar4->Pos).x;
      fVar7 = GetColumnOffset(in_stack_ffffffffffffff70);
      fVar7 = extra_flags + fVar7;
      iVar3 = pIVar1->ID + i;
      uVar8 = 0x40800000;
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffa4,fVar7 - 4.0,fVar6);
      ImVec2::ImVec2(&local_64,fVar7 + 4.0,_y);
      ImRect::ImRect((ImRect *)&stack0xffffffffffffffac,(ImVec2 *)&stack0xffffffffffffffa4,&local_64
                    );
      bVar2 = ItemAdd((ImRect *)in_stack_ffffffffffffff88,(ImGuiID)in_stack_ffffffffffffff84,
                      (ImRect *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                      (ImGuiItemFlags)extra_flags);
      if (bVar2) {
        if ((uVar10 & 2) == 0) {
          ButtonBehavior((ImRect *)CONCAT44(uVar10,in_stack_ffffffffffffffe0),(ImGuiID)fVar6,
                         (bool *)CONCAT44(iVar9,i),(bool *)pIVar5,(ImGuiButtonFlags)fVar7);
        }
        in_stack_ffffffffffffff70 = 0x1b;
        in_stack_ffffffffffffff94 = GetColorU32((ImGuiCol)extra_flags,3.78351e-44);
        in_stack_ffffffffffffff90 = (float)(int)fVar7;
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff88,in_stack_ffffffffffffff90,fVar6 + 1.0);
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff80,in_stack_ffffffffffffff90,_y);
        ImDrawList::AddLine((ImDrawList *)CONCAT44(fVar7,iVar3),
                            (ImVec2 *)CONCAT44(uVar8,in_stack_ffffffffffffffb8),
                            in_stack_ffffffffffffffb0,(ImU32)in_stack_ffffffffffffffac,
                            in_stack_ffffffffffffffa8);
      }
    }
    if (iVar9 != -1) {
      if ((pIVar1->IsBeingResized & 1U) == 0) {
        for (in_stack_ffffffffffffff7c = 0; in_stack_ffffffffffffff7c < pIVar1->Count + 1;
            in_stack_ffffffffffffff7c = in_stack_ffffffffffffff7c + 1) {
          pIVar5 = ImVector<ImGuiOldColumnData>::operator[]
                             (&pIVar1->Columns,in_stack_ffffffffffffff7c);
          fVar6 = pIVar5->OffsetNorm;
          pIVar5 = ImVector<ImGuiOldColumnData>::operator[]
                             (&pIVar1->Columns,in_stack_ffffffffffffff7c);
          pIVar5->OffsetNormBeforeResize = fVar6;
        }
      }
      in_stack_ffffffffffffffe0 = 0x1000000;
      pIVar1->IsBeingResized = true;
      GetDraggedColumnOffset
                ((ImGuiOldColumns *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 in_stack_ffffffffffffff7c);
      SetColumnOffset(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90);
    }
  }
  pIVar1->IsBeingResized = (bool)((byte)(in_stack_ffffffffffffffe0 >> 0x18) & 1);
  (pIVar4->WorkRect).Min = (pIVar4->ParentWorkRect).Min;
  (pIVar4->WorkRect).Max = (pIVar4->ParentWorkRect).Max;
  (pIVar4->ParentWorkRect).Min = (pIVar1->HostBackupParentWorkRect).Min;
  (pIVar4->ParentWorkRect).Max = (pIVar1->HostBackupParentWorkRect).Max;
  (pIVar4->DC).CurrentColumns = (ImGuiOldColumns *)0x0;
  (pIVar4->DC).ColumnsOffset.x = 0.0;
  (pIVar4->DC).CursorPos.x =
       (float)(int)((pIVar4->Pos).x + (pIVar4->DC).Indent.x + (pIVar4->DC).ColumnsOffset.x);
  return;
}

Assistant:

void ImGui::EndColumns()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    ImGuiOldColumns* columns = window->DC.CurrentColumns;
    IM_ASSERT(columns != NULL);

    PopItemWidth();
    if (columns->Count > 1)
    {
        PopClipRect();
        columns->Splitter.Merge(window->DrawList);
    }

    const ImGuiOldColumnFlags flags = columns->Flags;
    columns->LineMaxY = ImMax(columns->LineMaxY, window->DC.CursorPos.y);
    window->DC.CursorPos.y = columns->LineMaxY;
    if (!(flags & ImGuiOldColumnFlags_GrowParentContentsSize))
        window->DC.CursorMaxPos.x = columns->HostCursorMaxPosX;  // Restore cursor max pos, as columns don't grow parent

    // Draw columns borders and handle resize
    // The IsBeingResized flag ensure we preserve pre-resize columns width so back-and-forth are not lossy
    bool is_being_resized = false;
    if (!(flags & ImGuiOldColumnFlags_NoBorder) && !window->SkipItems)
    {
        // We clip Y boundaries CPU side because very long triangles are mishandled by some GPU drivers.
        const float y1 = ImMax(columns->HostCursorPosY, window->ClipRect.Min.y);
        const float y2 = ImMin(window->DC.CursorPos.y, window->ClipRect.Max.y);
        int dragging_column = -1;
        for (int n = 1; n < columns->Count; n++)
        {
            ImGuiOldColumnData* column = &columns->Columns[n];
            float x = window->Pos.x + GetColumnOffset(n);
            const ImGuiID column_id = columns->ID + ImGuiID(n);
            const float column_hit_hw = COLUMNS_HIT_RECT_HALF_WIDTH;
            const ImRect column_hit_rect(ImVec2(x - column_hit_hw, y1), ImVec2(x + column_hit_hw, y2));
            if (!ItemAdd(column_hit_rect, column_id, NULL, ImGuiItemFlags_NoNav))
                continue;

            bool hovered = false, held = false;
            if (!(flags & ImGuiOldColumnFlags_NoResize))
            {
                ButtonBehavior(column_hit_rect, column_id, &hovered, &held);
                if (hovered || held)
                    g.MouseCursor = ImGuiMouseCursor_ResizeEW;
                if (held && !(column->Flags & ImGuiOldColumnFlags_NoResize))
                    dragging_column = n;
            }

            // Draw column
            const ImU32 col = GetColorU32(held ? ImGuiCol_SeparatorActive : hovered ? ImGuiCol_SeparatorHovered : ImGuiCol_Separator);
            const float xi = IM_FLOOR(x);
            window->DrawList->AddLine(ImVec2(xi, y1 + 1.0f), ImVec2(xi, y2), col);
        }

        // Apply dragging after drawing the column lines, so our rendered lines are in sync with how items were displayed during the frame.
        if (dragging_column != -1)
        {
            if (!columns->IsBeingResized)
                for (int n = 0; n < columns->Count + 1; n++)
                    columns->Columns[n].OffsetNormBeforeResize = columns->Columns[n].OffsetNorm;
            columns->IsBeingResized = is_being_resized = true;
            float x = GetDraggedColumnOffset(columns, dragging_column);
            SetColumnOffset(dragging_column, x);
        }
    }
    columns->IsBeingResized = is_being_resized;

    window->WorkRect = window->ParentWorkRect;
    window->ParentWorkRect = columns->HostBackupParentWorkRect;
    window->DC.CurrentColumns = NULL;
    window->DC.ColumnsOffset.x = 0.0f;
    window->DC.CursorPos.x = IM_FLOOR(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);
}